

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

DecimalFormatSymbols * __thiscall
icu_63::RuleBasedNumberFormat::initializeDecimalFormatSymbols
          (RuleBasedNumberFormat *this,UErrorCode *status)

{
  UBool UVar1;
  DecimalFormatSymbols *pDVar2;
  DecimalFormatSymbols *local_50;
  LocalPointerBase<icu_63::DecimalFormatSymbols> local_20;
  LocalPointer<icu_63::DecimalFormatSymbols> temp;
  UErrorCode *status_local;
  RuleBasedNumberFormat *this_local;
  
  if (this->decimalFormatSymbols == (DecimalFormatSymbols *)0x0) {
    temp.super_LocalPointerBase<icu_63::DecimalFormatSymbols>.ptr =
         (LocalPointerBase<icu_63::DecimalFormatSymbols>)
         (LocalPointerBase<icu_63::DecimalFormatSymbols>)status;
    pDVar2 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)status);
    local_50 = (DecimalFormatSymbols *)0x0;
    if (pDVar2 != (DecimalFormatSymbols *)0x0) {
      DecimalFormatSymbols::DecimalFormatSymbols
                (pDVar2,&this->locale,
                 (UErrorCode *)temp.super_LocalPointerBase<icu_63::DecimalFormatSymbols>.ptr);
      local_50 = pDVar2;
    }
    LocalPointer<icu_63::DecimalFormatSymbols>::LocalPointer
              ((LocalPointer<icu_63::DecimalFormatSymbols> *)&local_20,local_50,
               (UErrorCode *)temp.super_LocalPointerBase<icu_63::DecimalFormatSymbols>.ptr);
    UVar1 = ::U_SUCCESS(*(UErrorCode *)temp.super_LocalPointerBase<icu_63::DecimalFormatSymbols>.ptr
                       );
    if (UVar1 != '\0') {
      pDVar2 = LocalPointerBase<icu_63::DecimalFormatSymbols>::orphan(&local_20);
      this->decimalFormatSymbols = pDVar2;
    }
    LocalPointer<icu_63::DecimalFormatSymbols>::~LocalPointer
              ((LocalPointer<icu_63::DecimalFormatSymbols> *)&local_20);
  }
  return this->decimalFormatSymbols;
}

Assistant:

DecimalFormatSymbols*
RuleBasedNumberFormat::initializeDecimalFormatSymbols(UErrorCode &status)
{
    // lazy-evaluate the DecimalFormatSymbols object.  This object
    // is shared by all DecimalFormat instances belonging to this
    // formatter
    if (decimalFormatSymbols == nullptr) {
        LocalPointer<DecimalFormatSymbols> temp(new DecimalFormatSymbols(locale, status), status);
        if (U_SUCCESS(status)) {
            decimalFormatSymbols = temp.orphan();
        }
    }
    return decimalFormatSymbols;
}